

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTransformers.cpp
# Opt level: O2

void iDynTree::reducedModelAddSolidShapes
               (Model *fullModel,Model *reducedModel,string *linkInReducedModel,
               Traversal *linkSubModel,FreeFloatingPos *pos,LinkPositions *subModelBase_X_link)

{
  pointer pvVar1;
  long lVar2;
  SolidShape *pSVar3;
  Traversal *this;
  uint uVar4;
  LinkIndex LVar5;
  Link *this_00;
  Transform *pTVar6;
  ModelSolidShapes *pMVar7;
  vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
  *pvVar8;
  vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
  *pvVar9;
  int shapeIdx;
  ulong uVar10;
  SolidShape *copiedShape;
  Transform subModelBase_H_visitedLink;
  Transform visitedLink_H_shape;
  SolidShape *local_188;
  Model *local_180;
  long local_178;
  Model *local_170;
  Traversal *local_168;
  LinkPositions *local_160;
  ulong local_158;
  Transform local_150 [96];
  Transform local_f0 [96];
  Transform local_90 [96];
  
  local_180 = fullModel;
  local_170 = reducedModel;
  local_160 = subModelBase_X_link;
  LVar5 = Model::getLinkIndex(reducedModel,linkInReducedModel);
  uVar10 = 0;
  local_178 = LVar5 * 0x18;
  local_168 = linkSubModel;
  while( true ) {
    this = local_168;
    uVar4 = Traversal::getNrOfVisitedLinks(local_168);
    if (uVar4 <= uVar10) break;
    this_00 = Traversal::getLink(this,uVar10);
    local_158 = uVar10;
    Traversal::getParentLink(this,uVar10);
    LVar5 = Link::getIndex(this_00);
    pTVar6 = LinkPositions::operator()(local_160,LVar5);
    iDynTree::Transform::Transform(local_150,pTVar6);
    pMVar7 = Model::visualSolidShapes(local_180);
    pvVar8 = ModelSolidShapes::getLinkSolidShapes(pMVar7);
    uVar10 = 0;
    while( true ) {
      pvVar1 = (pvVar8->
               super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)&pvVar1[LVar5].
                        super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                        ._M_impl.super__Vector_impl_data;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar1[LVar5].
                                 super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                                 ._M_impl.super__Vector_impl_data + 8) - lVar2 >> 3) <= uVar10)
      break;
      local_188 = (SolidShape *)(**(code **)(**(long **)(lVar2 + uVar10 * 8) + 0x10))();
      pTVar6 = SolidShape::getLink_H_geometry
                         (*(SolidShape **)
                           (*(long *)&(pvVar8->
                                      super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[LVar5].
                                      super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                                      ._M_impl.super__Vector_impl_data + uVar10 * 8));
      iDynTree::Transform::Transform(local_90,pTVar6);
      pSVar3 = local_188;
      iDynTree::Transform::operator*(local_f0,local_150);
      SolidShape::setLink_H_geometry(pSVar3,local_f0);
      pMVar7 = Model::visualSolidShapes(local_170);
      pvVar9 = ModelSolidShapes::getLinkSolidShapes(pMVar7);
      std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::push_back
                ((vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_> *)
                 ((long)&(((pvVar9->
                           super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                         )._M_impl.super__Vector_impl_data + local_178),&local_188);
      uVar10 = uVar10 + 1;
    }
    pMVar7 = Model::collisionSolidShapes(local_180);
    pvVar8 = ModelSolidShapes::getLinkSolidShapes(pMVar7);
    uVar10 = 0;
    while( true ) {
      pvVar1 = (pvVar8->
               super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)&pvVar1[LVar5].
                        super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                        ._M_impl.super__Vector_impl_data;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar1[LVar5].
                                 super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                                 ._M_impl.super__Vector_impl_data + 8) - lVar2 >> 3) <= uVar10)
      break;
      local_188 = (SolidShape *)(**(code **)(**(long **)(lVar2 + uVar10 * 8) + 0x10))();
      pTVar6 = SolidShape::getLink_H_geometry
                         (*(SolidShape **)
                           (*(long *)&(pvVar8->
                                      super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[LVar5].
                                      super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                                      ._M_impl.super__Vector_impl_data + uVar10 * 8));
      iDynTree::Transform::Transform(local_90,pTVar6);
      pSVar3 = local_188;
      iDynTree::Transform::operator*(local_f0,local_150);
      SolidShape::setLink_H_geometry(pSVar3,local_f0);
      pMVar7 = Model::collisionSolidShapes(local_170);
      pvVar9 = ModelSolidShapes::getLinkSolidShapes(pMVar7);
      std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::push_back
                ((vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_> *)
                 ((long)&(((pvVar9->
                           super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                         )._M_impl.super__Vector_impl_data + local_178),&local_188);
      uVar10 = uVar10 + 1;
    }
    uVar10 = local_158 + 1;
  }
  return;
}

Assistant:

void reducedModelAddSolidShapes(const Model& fullModel,
                                      Model& reducedModel,
                                const std::string linkInReducedModel,
                                const Traversal& linkSubModel,
                                const FreeFloatingPos& pos,
                                const LinkPositions& subModelBase_X_link)
{
    LinkIndex subModelBaseIndexInReducedModel = reducedModel.getLinkIndex(linkInReducedModel);

    // All the geometries collected in the traversal are lumped into the base link
    for(unsigned int traversalEl=0; traversalEl < linkSubModel.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = linkSubModel.getLink(traversalEl);
        LinkConstPtr parentLink  = linkSubModel.getParentLink(traversalEl);

        LinkIndex visitedLinkIndex = visitedLink->getIndex();
        Transform subModelBase_H_visitedLink     = subModelBase_X_link(visitedLinkIndex);

        // Add visual shapes to the new lumped link, i.e. the subModelBase
        auto& visualSolidShapes = fullModel.visualSolidShapes().getLinkSolidShapes();
        for(int shapeIdx=0; shapeIdx < visualSolidShapes[visitedLinkIndex].size(); shapeIdx++)
        {
            // Clone the shape
            SolidShape * copiedShape = visualSolidShapes[visitedLinkIndex][shapeIdx]->clone();

            // Update shape transform from the old link to the new link
            Transform visitedLink_H_shape = visualSolidShapes[visitedLinkIndex][shapeIdx]->getLink_H_geometry();
            copiedShape->setLink_H_geometry(subModelBase_H_visitedLink * visitedLink_H_shape);

            // Ownership of the new pointer is transfered to the ModelSolidShapes class
            // (it will be eventually deleted by the close() method
            reducedModel.visualSolidShapes().getLinkSolidShapes()[subModelBaseIndexInReducedModel].push_back(copiedShape);
        }

        // Add collision shapes to the new lumped link, i.e. the subModelBase
        auto& collisionSolidShapes = fullModel.collisionSolidShapes().getLinkSolidShapes();
        for(int shapeIdx=0; shapeIdx < collisionSolidShapes[visitedLinkIndex].size(); shapeIdx++)
        {
            // Clone the shape : ownership of the new pointer is transfered to the ModelSolidShapes class
            // (it will be eventually deleted by the close() method
            SolidShape * copiedShape = collisionSolidShapes[visitedLinkIndex][shapeIdx]->clone();

            // Update shape transform from the old link to the new link
            Transform visitedLink_H_shape = collisionSolidShapes[visitedLinkIndex][shapeIdx]->getLink_H_geometry();
            copiedShape->setLink_H_geometry(subModelBase_H_visitedLink*visitedLink_H_shape);

            // Ownership of the new pointer is transfered to the ModelSolidShapes class
            // (it will be eventually deleted by the close() method
            reducedModel.collisionSolidShapes().getLinkSolidShapes()[subModelBaseIndexInReducedModel].push_back(copiedShape);
        }
    }

}